

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  float x0;
  float y0;
  ImVec2 IVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  ImFont *pIVar7;
  ImFont **ppIVar8;
  uint uVar9;
  int iVar10;
  int off_y_1;
  long lVar11;
  uchar *puVar12;
  uint *puVar13;
  ulong uVar14;
  int off_x;
  ulong uVar15;
  ImFontAtlasCustomRect *pIVar16;
  uint uVar17;
  char *pcVar18;
  uint *puVar19;
  int off_y;
  int iVar20;
  uint uVar21;
  int off_y_2;
  int off_x_2;
  uint uVar22;
  long lVar23;
  int iVar24;
  size_t __n;
  float fVar25;
  int local_74;
  size_t local_50;
  
  iVar10 = atlas->PackIdMouseCursors;
  pIVar16 = (atlas->CustomRects).Data;
  lVar11 = (long)atlas->TexWidth;
  uVar14 = (ulong)pIVar16[iVar10].X;
  if ((atlas->Flags & 2) == 0) {
    uVar15 = (ulong)pIVar16[iVar10].Y;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar19 = atlas->TexPixelsRGBA32;
      puVar13 = puVar19 + (ulong)pIVar16[iVar10].X + lVar11 * uVar15;
      pcVar18 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
      ;
      iVar20 = 0;
      do {
        lVar11 = 0;
        do {
          puVar13[lVar11] = -(uint)(pcVar18[lVar11] == '.');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x6c);
        iVar20 = iVar20 + 1;
        puVar13 = puVar13 + atlas->TexWidth;
        pcVar18 = pcVar18 + 0x6c;
      } while (iVar20 != 0x1b);
      puVar19 = puVar19 + uVar14 + 0x6d + (long)atlas->TexWidth * uVar15;
      pcVar18 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
      ;
      iVar20 = 0;
      do {
        lVar11 = 0;
        do {
          puVar19[lVar11] = -(uint)(pcVar18[lVar11] == 'X');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x6c);
        iVar20 = iVar20 + 1;
        puVar19 = puVar19 + atlas->TexWidth;
        pcVar18 = pcVar18 + 0x6c;
      } while (iVar20 != 0x1b);
    }
    else {
      puVar12 = atlas->TexPixelsAlpha8 + lVar11 * uVar15 + uVar14;
      pcVar18 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
      ;
      iVar20 = 0;
      do {
        lVar11 = 0;
        do {
          puVar12[lVar11] = -(pcVar18[lVar11] == '.');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x6c);
        iVar20 = iVar20 + 1;
        puVar12 = puVar12 + atlas->TexWidth;
        pcVar18 = pcVar18 + 0x6c;
      } while (iVar20 != 0x1b);
      puVar12 = atlas->TexPixelsAlpha8 +
                (long)atlas->TexWidth * (ulong)pIVar16[iVar10].Y + uVar14 + 0x6d;
      pcVar18 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
      ;
      iVar20 = 0;
      do {
        lVar11 = 0;
        do {
          puVar12[lVar11] = -(pcVar18[lVar11] == 'X');
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x6c);
        iVar20 = iVar20 + 1;
        puVar12 = puVar12 + atlas->TexWidth;
        pcVar18 = pcVar18 + 0x6c;
      } while (iVar20 != 0x1b);
    }
  }
  else {
    lVar23 = (ulong)pIVar16[iVar10].Y * lVar11 + uVar14;
    iVar20 = (int)lVar23;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar19 = atlas->TexPixelsRGBA32;
      puVar13 = puVar19 + (atlas->TexWidth + iVar20);
      puVar13[0] = 0xffffffff;
      puVar13[1] = 0xffffffff;
      puVar19 = puVar19 + iVar20;
      puVar19[0] = 0xffffffff;
      puVar19[1] = 0xffffffff;
    }
    else {
      lVar11 = iVar20 + lVar11;
      atlas->TexPixelsAlpha8[lVar11 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar11] = 0xff;
      atlas->TexPixelsAlpha8[lVar23 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar23] = 0xff;
    }
  }
  uVar9._0_2_ = pIVar16[iVar10].X;
  uVar9._2_2_ = pIVar16[iVar10].Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar9 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar9 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar16 = (atlas->CustomRects).Data + atlas->PackIdLines;
    local_50 = 0;
    lVar11 = -0x40;
    local_74 = 0;
    iVar10 = 0;
    do {
      uVar3 = pIVar16->Width;
      uVar9 = iVar10 + (uint)uVar3;
      uVar22 = uVar9 >> 1;
      iVar20 = (int)lVar11;
      uVar17 = uVar22 + 0x40 + iVar20;
      iVar24 = (uVar3 - uVar22) + iVar10;
      puVar12 = atlas->TexPixelsAlpha8;
      if (puVar12 == (uchar *)0x0) {
        puVar19 = atlas->TexPixelsRGBA32;
        uVar4 = pIVar16->X;
        uVar5 = pIVar16->Y;
        iVar6 = atlas->TexWidth;
        puVar13 = puVar19 + (((uint)uVar5 + iVar20 + 0x40) * iVar6 + (uint)uVar4);
        if (1 < uVar9) {
          memset(puVar13,0,(ulong)(uVar22 + (uVar22 == 0)) << 2);
        }
        if (lVar11 != -0x40) {
          memset(puVar13 + uVar22,0xff,local_50);
        }
        if (uVar17 != uVar3) {
          puVar19 = puVar19 + (ulong)uVar22 +
                              (ulong)(iVar6 * ((uint)uVar5 + local_74) + (uint)uVar4) +
                              lVar11 + 0x40;
          __n = (ulong)(iVar24 + (uint)(iVar24 == 0)) << 2;
          goto LAB_0013af52;
        }
      }
      else {
        uVar4 = pIVar16->X;
        uVar5 = pIVar16->Y;
        iVar6 = atlas->TexWidth;
        if (1 < uVar9) {
          memset(puVar12 + (((uint)uVar5 + iVar20 + 0x40) * iVar6 + (uint)uVar4),0,
                 (ulong)(uVar22 + (uVar22 == 0)));
        }
        if (lVar11 != -0x40) {
          memset(puVar12 + (((uint)uVar5 + iVar20 + 0x40) * iVar6 + (uint)uVar4) + uVar22,0xff,
                 lVar11 + 0x40);
        }
        if (uVar17 != uVar3) {
          puVar19 = (uint *)(puVar12 +
                            lVar11 + (ulong)(iVar6 * ((uint)uVar5 + local_74) + (uint)uVar4) +
                                     (ulong)uVar22 + 0x40);
          __n = (size_t)(iVar24 + (uint)(iVar24 == 0));
LAB_0013af52:
          memset(puVar19,0,__n);
        }
      }
      uVar3 = pIVar16->X;
      uVar4 = pIVar16->Y;
      fVar1 = (atlas->TexUvScale).x;
      fVar25 = (atlas->TexUvScale).y;
      (&atlas->TexUvLines[0].x)[local_50] = (float)((uVar3 + uVar22) - 1) * fVar1;
      fVar25 = ((float)(int)(iVar20 + 0x41 + (uint)uVar4) * fVar25 +
               (float)(int)(iVar20 + 0x40 + (uint)uVar4) * fVar25) * 0.5;
      *(ulong *)(&atlas->TexUvLines[0].y + local_50) =
           CONCAT44(fVar1 * (float)(iVar20 + 0x41 + uVar22 + uVar3),fVar25);
      (&atlas->TexUvLines[0].w)[local_50] = fVar25;
      iVar10 = iVar10 + -1;
      local_74 = local_74 + 1;
      local_50 = local_50 + 4;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0);
  }
  if (0 < (atlas->CustomRects).Size) {
    lVar11 = 0;
    lVar23 = 0;
    do {
      pIVar16 = (atlas->CustomRects).Data;
      pIVar7 = *(ImFont **)((long)&pIVar16->Font + lVar11);
      if ((pIVar7 != (ImFont *)0x0) &&
         (iVar10 = *(int *)((long)&pIVar16->GlyphID + lVar11), iVar10 != 0)) {
        uVar9 = (uint)*(ushort *)((long)&pIVar16->X + lVar11);
        fVar1 = (atlas->TexUvScale).x;
        fVar25 = (atlas->TexUvScale).y;
        uVar22 = (uint)*(ushort *)((long)&pIVar16->Y + lVar11);
        uVar21 = (uint)*(ushort *)((long)&pIVar16->Width + lVar11);
        uVar17 = (uint)*(ushort *)((long)&pIVar16->Height + lVar11);
        x0 = *(float *)((long)&(pIVar16->GlyphOffset).x + lVar11);
        y0 = *(float *)((long)&(pIVar16->GlyphOffset).y + lVar11);
        ImFont::AddGlyph(pIVar7,(ImFontConfig *)0x0,(ImWchar)iVar10,x0,y0,(float)uVar21 + x0,
                         (float)uVar17 + y0,(float)uVar9 * fVar1,(float)uVar22 * fVar25,
                         (float)(uVar9 + uVar21) * fVar1,(float)(uVar22 + uVar17) * fVar25,
                         *(float *)((long)&pIVar16->GlyphAdvanceX + lVar11));
      }
      lVar23 = lVar23 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar23 < (atlas->CustomRects).Size);
  }
  uVar9 = (atlas->Fonts).Size;
  if (0 < (int)uVar9) {
    lVar11 = 0;
    do {
      pIVar7 = (atlas->Fonts).Data[lVar11];
      if (pIVar7->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar7);
      }
      lVar11 = lVar11 + 1;
      uVar9 = (atlas->Fonts).Size;
    } while (lVar11 < (int)uVar9);
  }
  if (0 < (int)uVar9) {
    ppIVar8 = (atlas->Fonts).Data;
    uVar14 = 0;
    do {
      pIVar7 = ppIVar8[uVar14];
      if (pIVar7->EllipsisChar == 0xffff) {
        lVar11 = 0;
        do {
          uVar3 = *(ushort *)((long)&DAT_00169674 + lVar11);
          if ((((ulong)uVar3 < (ulong)(long)(pIVar7->IndexLookup).Size) &&
              ((pIVar7->IndexLookup).Data[uVar3] != 0xffff)) &&
             ((pIVar7->Glyphs).Data != (ImFontGlyph *)0x0)) {
            pIVar7->EllipsisChar = uVar3;
            break;
          }
          lVar11 = lVar11 + 2;
        } while (lVar11 == 2);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar9);
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}